

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# queue_generic_tests.h
# Opt level: O3

reentrant_put_transaction<void> *
density_tests::detail::
PutTestObject<density::sp_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)0,_density::default_busy_wait>,_256UL,_128UL>
::reentrant_put(reentrant_put_transaction<void> *__return_storage_ptr__,
               conc_heter_queue<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<65536UL>_>
               *i_queue,EasyRandom *param_2)

{
  reentrant_put_transaction<density_tests::TestObject<256UL,_128UL>_> transaction;
  reentrant_put_transaction<density_tests::TestObject<256UL,_128UL>_> local_260;
  reentrant_put_transaction<density_tests::TestObject<256UL,_128UL>_> local_240;
  reentrant_put_transaction<density_tests::TestObject<256UL,_128UL>_> local_220;
  TestObject<256UL,_128UL> local_200;
  
  TestObject<256UL,_128UL>::TestObject(&local_200);
  density::
  sp_heter_queue<density::runtime_type<>,density::basic_default_allocator<65536ul>,(density::concurrency_cardinality)0,(density::concurrency_cardinality)0,density::default_busy_wait>
  ::
  start_reentrant_emplace<density_tests::TestObject<256ul,128ul>,density_tests::TestObject<256ul,128ul>>
            (&local_240,
             (sp_heter_queue<density::runtime_type<>,density::basic_default_allocator<65536ul>,(density::concurrency_cardinality)0,(density::concurrency_cardinality)0,density::default_busy_wait>
              *)i_queue,&local_200);
  local_220.m_put.m_user_storage = local_240.m_put.m_user_storage;
  local_220.m_put.m_control_block = local_240.m_put.m_control_block;
  local_220.m_put.m_next_ptr = local_240.m_put.m_next_ptr;
  local_220.m_queue = local_240.m_queue;
  local_240.m_put.m_user_storage = (void *)0x0;
  density::
  sp_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)0,_density::default_busy_wait>
  ::reentrant_put_transaction<density_tests::TestObject<256UL,_128UL>_>::~reentrant_put_transaction
            (&local_240);
  local_260.m_put.m_control_block = local_220.m_put.m_control_block;
  local_260.m_put.m_next_ptr = local_220.m_put.m_next_ptr;
  local_260.m_put.m_user_storage = local_220.m_put.m_user_storage;
  local_260.m_queue = local_240.m_queue;
  local_220.m_put.m_user_storage = (void *)0x0;
  density::
  sp_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)0,_density::default_busy_wait>
  ::reentrant_put_transaction<density_tests::TestObject<256UL,_128UL>_>::~reentrant_put_transaction
            (&local_220);
  TestObject<256UL,_128UL>::~TestObject(&local_200);
  exception_checkpoint();
  (__return_storage_ptr__->m_put).m_user_storage = local_260.m_put.m_user_storage;
  (__return_storage_ptr__->m_put).m_control_block = local_260.m_put.m_control_block;
  (__return_storage_ptr__->m_put).m_next_ptr = local_260.m_put.m_next_ptr;
  __return_storage_ptr__->m_queue = local_240.m_queue;
  local_260.m_put.m_user_storage = (void *)0x0;
  density::
  sp_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)0,_density::default_busy_wait>
  ::reentrant_put_transaction<density_tests::TestObject<256UL,_128UL>_>::~reentrant_put_transaction
            (&local_260);
  return __return_storage_ptr__;
}

Assistant:

static typename QUEUE::template reentrant_put_transaction<void>
              reentrant_put(QUEUE & i_queue, EasyRandom &)
            {
                auto transaction = i_queue.start_reentrant_push(ElementType());
                exception_checkpoint();
                return std::move(transaction);
            }